

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piecewise_linear.cpp
# Opt level: O0

double __thiscall
mp::
BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AtanhId>_>
::ComputeInitialStepLength
          (BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AtanhId>_>
           *this,double x0)

{
  long *in_RDI;
  double in_XMM0_Qa;
  double dVar1;
  double dx0;
  double f2;
  double local_28;
  double local_8;
  
  dVar1 = (double)(**(code **)(*in_RDI + 0x68))(in_XMM0_Qa);
  if (1e-100 <= ABS(dVar1)) {
    local_28 = sqrt(ABS(((*(double *)(in_RDI[2] + 0x28) * 8.0) / 3.0) / dVar1));
    dVar1 = ub_sub((BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AtanhId>_>
                    *)0x55350a);
    if (dVar1 < in_XMM0_Qa + local_28) {
      local_28 = ub_sub((BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AtanhId>_>
                         *)0x553522);
      local_28 = local_28 - in_XMM0_Qa;
    }
    if (local_28 < 1e-10) {
      dVar1 = ub_sub((BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AtanhId>_>
                      *)0x553548);
      local_28 = (dVar1 - in_XMM0_Qa) / 100.0;
    }
    local_8 = local_28;
  }
  else {
    dVar1 = ub_sub((BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AtanhId>_>
                    *)0x553494);
    local_8 = (dVar1 - in_XMM0_Qa) / 100.0;
  }
  return local_8;
}

Assistant:

double BasicPLApproximator<FuncCon>::ComputeInitialStepLength(
    double x0) {
  /// Quadratic approximation from current left point
  auto f2 = eval_2nd(x0);             // f''(x0)
  if (std::fabs(f2)<1e-100)           // cannot do,
    return (ub_sub()-x0)/100;         // return interval/100
  /// Initial step
  auto dx0 = std::sqrt(
        std::fabs(laPrm_.ubErr * 8.0 / 3.0 / f2) );
  if (x0+dx0 > ub_sub())
    dx0 = ub_sub()-x0;
  if (dx0<1e-10)
    dx0 = (ub_sub()-x0) / 100.0;
  return dx0;
}